

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndividualBeliefJESP.cpp
# Opt level: O2

double __thiscall
IndividualBeliefJESP::Update
          (IndividualBeliefJESP *this,IndividualBeliefJESP *b_prev,Index lastAI,Index newOI,
          JointPolicyPureVector *jpol)

{
  SDV *this_00;
  MultiAgentDecisionProcessDiscreteInterface *pMVar1;
  PlanningUnitMADPDiscrete *this_01;
  int iVar2;
  uint uVar3;
  Index IVar4;
  value_type vVar5;
  undefined4 uVar6;
  Index IVar7;
  undefined4 extraout_var;
  reference pvVar8;
  size_t sVar9;
  reference pvVar10;
  uint uVar11;
  ulong uVar12;
  Index eI;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  uint local_168;
  double local_160;
  ulong local_148;
  Index next_oHist_j;
  Scope otherAgentIndices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> actions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> prev_oHist_others;
  vector<unsigned_int,_std::allocator<unsigned_int>_> next_oHist_others;
  vector<double,_std::allocator<double>_> newJB_unnorm;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrO_others;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oIs_others;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oIs;
  
  otherAgentIndices.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&newJB_unnorm,
             (long)(this->super_Belief)._m_b.super_SDV.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->super_Belief)._m_b.super_SDV.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(value_type_conflict3 *)&otherAgentIndices,
             (allocator_type *)&nrO_others);
  StateDistributionVector::operator=(&(this->super_Belief)._m_b,&newJB_unnorm);
  this_00 = &(this->super_Belief)._m_b.super_SDV;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&newJB_unnorm.super__Vector_base<double,_std::allocator<double>_>);
  newJB_unnorm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  newJB_unnorm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  newJB_unnorm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  nrO_others.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nrO_others.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nrO_others.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  otherAgentIndices.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  otherAgentIndices.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  otherAgentIndices.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148 = 1;
  uVar3 = 0;
  while (actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start._0_4_ = uVar3,
        iVar2 = (*(this->_m_pumadp->super_PlanningUnit)._vptr_PlanningUnit[6])(),
        (ulong)uVar3 < CONCAT44(extraout_var,iVar2)) {
    if ((uint)actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != this->_m_agentI) {
      pMVar1 = this->_m_pumadp->_m_madp;
      uVar3 = (**(code **)((long)*pMVar1 + 0xc0))
                        (pMVar1,(uint)actions.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      prev_oHist_others.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(ulong)uVar3;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&nrO_others,(unsigned_long *)&prev_oHist_others);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&otherAgentIndices.super_SDT,(value_type_conflict1 *)&actions);
      local_148 = local_148 * (long)(ulong)uVar3;
    }
    uVar3 = (uint)actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start + 1;
  }
  local_160 = 0.0;
  for (local_168 = 0; uVar3 = (**(code **)(*(long *)&b_prev->super_Belief + 0x70))(),
      local_168 < uVar3; local_168 = local_168 + 1) {
    dVar14 = (double)(**(code **)(*(long *)&b_prev->super_Belief + 0x48))();
    if (0.0 < dVar14) {
      IVar4 = GetStateIndex(b_prev,local_168);
      GetOthersObservationHistIndex(&prev_oHist_others,b_prev,local_168);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&actions,this->_m_nrAgents,(allocator_type *)&oIs);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         (&actions,(ulong)this->_m_agentI);
      *pvVar8 = lastAI;
      for (uVar3 = 0; uVar13 = (ulong)uVar3,
          uVar13 < (ulong)((long)otherAgentIndices.super_SDT.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)otherAgentIndices.super_SDT.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2); uVar3 = uVar3 + 1)
      {
        uVar11 = otherAgentIndices.super_SDT.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13];
        vVar5 = (*(jpol->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
                  _vptr_JointPolicy[0x13])
                          (jpol,(ulong)uVar11,
                           (ulong)prev_oHist_others.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar13]);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           (&actions,(ulong)uVar11);
        *pvVar8 = vVar5;
      }
      iVar2 = (*(this->_m_pumadp->super_PlanningUnit)._vptr_PlanningUnit[9])
                        (this->_m_pumadp,&actions);
      for (uVar3 = 0; sVar9 = PlanningUnitMADPDiscrete::GetNrStates(this->_m_pumadp), uVar3 < sVar9;
          uVar3 = uVar3 + 1) {
        pMVar1 = this->_m_pumadp->_m_madp;
        dVar15 = (double)(**(code **)((long)*pMVar1 + 0x108))(pMVar1,IVar4,iVar2);
        if (0.0 < dVar15) {
          for (uVar13 = 0; uVar13 < local_148; uVar13 = (ulong)((Index)uVar13 + 1)) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&oIs,this->_m_nrAgents,(allocator_type *)&oIs_others);
            pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                               (&oIs,(ulong)this->_m_agentI);
            *pvVar8 = newOI;
            IndexTools::JointToIndividualIndices(&oIs_others,(Index)uVar13,&nrO_others);
            for (uVar11 = 0; uVar12 = (ulong)uVar11,
                uVar12 < (ulong)((long)otherAgentIndices.super_SDT.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)otherAgentIndices.super_SDT.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2);
                uVar11 = uVar11 + 1) {
              pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                 (&oIs_others,uVar12);
              vVar5 = *pvVar8;
              pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                 (&otherAgentIndices.super_SDT,uVar12);
              pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                 (&oIs,(ulong)*pvVar8);
              *pvVar8 = vVar5;
            }
            pMVar1 = this->_m_pumadp->_m_madp;
            uVar6 = (**(code **)((long)*pMVar1 + 0xe0))(pMVar1,(allocator_type *)&oIs);
            pMVar1 = this->_m_pumadp->_m_madp;
            dVar16 = (double)(**(code **)((long)*pMVar1 + 0x118))(pMVar1,iVar2,uVar3,uVar6);
            next_oHist_others.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            next_oHist_others.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            next_oHist_others.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            for (uVar11 = 0; uVar12 = (ulong)uVar11,
                uVar12 < (ulong)((long)otherAgentIndices.super_SDT.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)otherAgentIndices.super_SDT.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2);
                uVar11 = uVar11 + 1) {
              this_01 = this->_m_pumadp;
              pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                 (&otherAgentIndices.super_SDT,uVar12);
              next_oHist_j = PlanningUnitMADPDiscrete::GetSuccessorOHI
                                       (this_01,*pvVar8,
                                        prev_oHist_others.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar12],
                                        oIs_others.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar12]);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&next_oHist_others,&next_oHist_j);
            }
            IVar7 = GetAugmentedStateIndex(this,uVar3,&next_oHist_others);
            pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_00,(ulong)IVar7);
            dVar16 = dVar16 * dVar15 * dVar14;
            *pvVar10 = dVar16 + *pvVar10;
            local_160 = local_160 + dVar16;
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&next_oHist_others.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&oIs_others);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&oIs);
          }
        }
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&actions.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&prev_oHist_others.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
      ;
    }
  }
  for (uVar13 = 0; uVar3 = (**(code **)(*(long *)&this->super_Belief + 0x70))(this), uVar13 < uVar3;
      uVar13 = uVar13 + 1) {
    pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_00,uVar13);
    dVar14 = *pvVar10;
    pvVar10 = std::vector<double,_std::allocator<double>_>::at(this_00,uVar13);
    *pvVar10 = dVar14 / local_160;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&nrO_others.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&otherAgentIndices);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&newJB_unnorm.super__Vector_base<double,_std::allocator<double>_>);
  return local_160;
}

Assistant:

double IndividualBeliefJESP::Update(
        const IndividualBeliefJESP& b_prev, 
           Index lastAI, Index newOI, const JointPolicyPureVector* jpol)
{
    //set all probs of this belief to 0
    _m_b = vector<double>(_m_b.size(), 0.0);

    double Po_ba = 0.0; // P(o|b,a) with o=newJO
    vector<double> newJB_unnorm;

    size_t nrJO_others = 1;
    Scope otherAgentIndices;
    vector<size_t> nrO_others; 
    for(Index j=0; j < _m_pumadp->GetNrAgents(); j++)
    {
        if(j == _m_agentI)
            continue;
        //else
        Index nrO_j =  _m_pumadp->GetNrObservations(j);
        nrJO_others *= nrO_j;
        nrO_others.push_back(nrO_j);
        otherAgentIndices.push_back(j);
    }

    for(Index prev_eI=0; prev_eI < b_prev.Size(); prev_eI++)
    {
        double probPrev_eI=b_prev.Get(prev_eI);
        if(probPrev_eI>0)// only need to do this if this previous eI is possible
        {
            Index prev_sI = b_prev.GetStateIndex(prev_eI);
            vector<Index> prev_oHist_others = b_prev.
                GetOthersObservationHistIndex(prev_eI);
            vector<Index> actions(_m_nrAgents);
            actions.at(_m_agentI) = lastAI;
            for(Index j=0; j < otherAgentIndices.size(); j++)
            {
                Index ag_j = otherAgentIndices[j];
                Index prev_oHist_j = prev_oHist_others[j];//not ag_j!!!
                Index act_j = jpol->GetActionIndex(ag_j, prev_oHist_j);
                actions.at(ag_j) = act_j;
            }
            Index jaI = _m_pumadp->IndividualToJointActionIndices(actions);
            
            for(Index next_sI=0; next_sI < _m_pumadp->GetNrStates(); next_sI++)
            {
                //note we do not loop over all possible next_eI, because *a lot*
                //of transitions will be 0 ( if next_oHistJ != (prev_oHistJ, oJ) )
                //
                //rather we now loop over all possible oJ (observations of others)
                double Ps_as = _m_pumadp->
                    GetTransitionProbability(prev_sI, jaI, next_sI);
                
                if(Ps_as>0) // only need to do this if this transition can occur
                {
                    for(Index JO_o=0; JO_o < nrJO_others; JO_o++)
                    {
                        vector<Index> oIs(_m_nrAgents);
                        oIs.at(_m_agentI) = newOI; // `our' observation is fixed
                        vector<Index> oIs_others = IndexTools::JointToIndividualIndices(
                            JO_o, nrO_others);
                        for(Index j=0; j < otherAgentIndices.size(); j++)
                            oIs.at( otherAgentIndices.at(j) ) = oIs_others.at(j);
                        
                        Index joI = _m_pumadp->IndividualToJointObservationIndices(oIs);
                        //compute P(joI | jaI,s')
                        double Po_as = _m_pumadp->GetObservationProbability(
                            jaI, next_sI, joI);
                        
                        //prob of next_eI = <next_sI, (oHist_others, oIs_others)>
                        //AND prev_sI can now be computed.
                        //
                        //first, however, lets find the index, next_eI, for 
                        // <next_sI, (oHist_others, oIs_others)>
                    
                        // first find the next_oHist_others indices.
                        vector<Index> next_oHist_others;
                        for(Index j=0; j < otherAgentIndices.size(); j++)
                        {
                            Index next_oHist_j = _m_pumadp->GetSuccessorOHI(otherAgentIndices.at(j), 
                                                                            prev_oHist_others[j],
                                                                            oIs_others[j] );
                            next_oHist_others.push_back(next_oHist_j);
                        }
                        Index next_eI = GetAugmentedStateIndex(next_sI, 
                                                               next_oHist_others);

                        //p += P(oi | ai, <s',oH'>) * P(<s',oH'>|<s,oH>,ai) * b(<s,oH>)
                        //      = P(oi, <s',oH'>|<s,oH'>,ai) * b(<s,oH>)
                        //      = P(s', jo | s, ja) b(<s,oH>)  //ja=<ai, aj>,aj=pol(oHj)
                        //      = P(jo|ja,s')*P(s'|s,ja)
                        double Pso_sa =  Po_as * Ps_as * probPrev_eI;
                        _m_b.at(next_eI) += Pso_sa;
                        Po_ba += Pso_sa; //running sum of P(oi|b,ai)
                    }
                }
            }
        }
    }
    for(Index eI=0; eI < this->Size(); eI++)
        _m_b.at(eI) = _m_b.at(eI) / Po_ba;

    return(Po_ba);

}